

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O2

FString __thiscall FPlayList::NextLine(FPlayList *this,FILE *file)

{
  char cVar1;
  char *pcVar2;
  char *copyStr;
  undefined8 uStack_230;
  char buffer [512];
  
  do {
    uStack_230 = 0x31d982;
    pcVar2 = fgets(buffer,0x200,(FILE *)file);
    copyStr = (char *)((long)&uStack_230 + 7);
    if (pcVar2 == (char *)0x0) {
      uStack_230 = 0x31d9d8;
      FString::FString((FString *)this,(char *)"");
      return (FString)(char *)this;
    }
    do {
      cVar1 = copyStr[1];
      copyStr = copyStr + 1;
      if (cVar1 == '\0') break;
    } while (cVar1 < '!');
    if ((cVar1 != '\0') && (cVar1 != '#')) {
      uStack_230 = 0x31d9aa;
      FString::FString((FString *)this,copyStr);
      uStack_230 = 0x31d9b9;
      FString::StripRight((FString *)this,"\r\n");
      uStack_230 = 0x31d9c7;
      FString::ReplaceChars((FString *)this,'\\','/');
      return (FString)(char *)this;
    }
  } while( true );
}

Assistant:

FString FPlayList::NextLine (FILE *file)
{
	char buffer[512];
	char *skipper;

	do
	{
		if (NULL == fgets (buffer, countof(buffer), file))
			return "";

		for (skipper = buffer; *skipper != 0 && *skipper <= ' '; skipper++)
			;
	} while (*skipper == '#' || *skipper == 0);

	FString str(skipper);
	str.StripRight("\r\n");
	FixPathSeperator(str);
	return str;
}